

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void mp::WriteJSON<mp::LinTerms,mp::AlgConRhs<_2>>
               (JSONW *jw,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> *algc)

{
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> *in_RSI;
  char *in_RDI;
  AlgConRhs<_2> acrhs;
  LinTerms *in_stack_00000018;
  JSONW *in_stack_00000020;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *this;
  JSONW *in_stack_ffffffffffffffa0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_RDI);
  this = &local_20;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>::GetBody(local_10);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::LinTerms>
            (in_stack_00000020,in_stack_00000018);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2481db);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  acrhs = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>::GetRhsOrRange(local_10);
  WriteJSON<_2>(in_stack_ffffffffffffffa0,(AlgConRhs<_2> *)acrhs.rhs_);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x248235);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const AlgebraicConstraint<Body, RhsOrRange>& algc) {
  WriteJSON(jw["body"], algc.GetBody());
  WriteJSON(jw["rhs_or_range"], algc.GetRhsOrRange());
}